

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O0

uint zvgEnv(uint *portAdr,uint *monitor)

{
  int iVar1;
  ushort **ppuVar2;
  ulong uVar3;
  char *pcStack_30;
  char cmd;
  char *envP;
  char *env;
  uint *monitor_local;
  uint *portAdr_local;
  
  env = (char *)monitor;
  monitor_local = portAdr;
  pcStack_30 = getenv("ZVGPORT");
  envP = pcStack_30;
  if (pcStack_30 == (char *)0x0) {
    portAdr_local._4_4_ = 1;
  }
  else {
    while (*pcStack_30 != '\0') {
      for (; *pcStack_30 == ' '; pcStack_30 = pcStack_30 + 1) {
      }
      iVar1 = toupper((int)*pcStack_30);
      do {
        pcStack_30 = pcStack_30 + 1;
      } while (*pcStack_30 == ' ');
      if ((char)iVar1 == 'M') {
        ppuVar2 = __ctype_b_loc();
        if (((*ppuVar2)[(int)*pcStack_30] & 0x800) == 0) {
          return 6;
        }
        uVar3 = strtoul(pcStack_30,&stack0xffffffffffffffd0,10);
        *(int *)env = (int)uVar3;
      }
      else if ((char)iVar1 == 'P') {
        ppuVar2 = __ctype_b_loc();
        if (((*ppuVar2)[(int)*pcStack_30] & 0x800) == 0) {
          return 2;
        }
        uVar3 = strtoul(pcStack_30,&stack0xffffffffffffffd0,0x10);
        *monitor_local = (uint)uVar3;
      }
    }
    portAdr_local._4_4_ = 0;
  }
  return portAdr_local._4_4_;
}

Assistant:

uint zvgEnv( uint *portAdr, uint *monitor)
{
	char	*env, *envP, cmd;

	env = getenv("ZVGPORT");				// look for environment variable

	if (env == NULL)
		return (errNoEnv);					// no environment variable found

	// Look for 'P', 'D' or 'I' attributes
	envP = env;									// point to environment string

	while (*envP != '\0')
	{
		while (*envP == ' ')					// skip leading blanks
			envP++;

		cmd = toupper( *envP);
		envP++;									// skip command character

		while (*envP == ' ')
			envP++;								// skip blanks

		// decode attribute

		switch (cmd)
		{
		case 'P':								// check for 'P'ort address
			if (!isdigit( *envP))
				return (errEnvPort);			// bad environment port value

			*portAdr = strtoul( envP, &envP, 16);	// read port address
			break;

		case 'M':								// or check for 'M'onitor type
			if (!isdigit( *envP))
				return (errEnvMon);			// bad environment monitor value

			*monitor = strtoul( envP, &envP, 10);		// read monitor type
			break;
		}
	}
	return (errOk);
}